

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::CheckInvariants(LinearScan *this)

{
  RegNum RVar1;
  Lifetime *pLVar2;
  StackSym *this_00;
  code *pcVar3;
  LinearScan *pLVar4;
  bool bVar5;
  uint uVar6;
  BVIndex BVar7;
  undefined4 *puVar8;
  Type *ppLVar9;
  Type pLVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint32 uVar16;
  int i;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar17;
  ulong uVar18;
  Iterator local_48;
  LinearScan *local_38;
  
  uVar12 = (this->nonAllocatableRegs).word;
  pSVar17 = this->activeLiveranges;
  local_48.list = &pSVar17->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.current = (NodeBase *)pSVar17;
  local_38 = this;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar14 = 0;
  while( true ) {
    if (pSVar17 == (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_005809d7;
      *puVar8 = 0;
      pSVar17 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    }
    pSVar17 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
              (pSVar17->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (pSVar17 == (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list) break;
    local_48.current = (NodeBase *)pSVar17;
    ppLVar9 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    RVar1 = (*ppLVar9)->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
    if ((uVar12 >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16a,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar5) goto LAB_005809d7;
      *puVar8 = 0;
    }
    RVar1 = (*ppLVar9)->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
    pLVar10 = *ppLVar9;
    uVar11 = *(ushort *)&pLVar10->field_0x9c;
    if ((uVar11 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16c,"(!lifetime->isOpHelperSpilled)","!lifetime->isOpHelperSpilled");
      if (!bVar5) goto LAB_005809d7;
      *puVar8 = 0;
      pLVar10 = *ppLVar9;
      uVar11 = *(ushort *)&pLVar10->field_0x9c;
    }
    if ((uVar11 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16d,"(!lifetime->isSpilled)","!lifetime->isSpilled");
      if (!bVar5) goto LAB_005809d7;
      *puVar8 = 0;
      pLVar10 = *ppLVar9;
    }
    uVar6 = pLVar10->end;
    if (uVar6 < uVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16e,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar5) goto LAB_005809d7;
      *puVar8 = 0;
      uVar6 = (*ppLVar9)->end;
    }
    uVar12 = uVar12 | 1L << ((ulong)RVar1 & 0x3f);
    pSVar17 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    uVar14 = uVar6;
  }
  if (uVar12 != (local_38->activeRegs).word) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x174,"(bv.Equal(this->activeRegs))","bv.Equal(this->activeRegs)");
    if (!bVar5) goto LAB_005809d7;
    *puVar8 = 0;
    uVar12 = (local_38->activeRegs).word;
  }
  if (uVar12 == 0) {
    uVar13 = 0;
    uVar15 = 0;
  }
  else {
    uVar18 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
      }
    }
    uVar15 = 0;
    uVar13 = 0;
    do {
      BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar18);
      uVar12 = uVar12 & ~(1L << (uVar18 & 0x3f));
      bVar5 = IRType_IsFloat(RegTypes[uVar18]);
      uVar13 = uVar13 + bVar5;
      uVar15 = uVar15 + !bVar5;
      uVar18 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
    } while (uVar12 != 0);
  }
  pLVar4 = local_38;
  if (uVar15 != local_38->intRegUsedCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x183,"(ints == this->intRegUsedCount)","ints == this->intRegUsedCount");
    if (!bVar5) goto LAB_005809d7;
    *puVar8 = 0;
  }
  if (uVar13 != pLVar4->floatRegUsedCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x184,"(floats == this->floatRegUsedCount)",
                       "floats == this->floatRegUsedCount");
    if (!bVar5) goto LAB_005809d7;
    *puVar8 = 0;
    uVar13 = pLVar4->floatRegUsedCount;
  }
  uVar15 = pLVar4->intRegUsedCount;
  BVar7 = BVUnitT<unsigned_long>::CountBit((pLVar4->activeRegs).word);
  if (uVar13 + uVar15 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x185,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count())"
                       ,
                       "(this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count()"
                      );
    if (!bVar5) goto LAB_005809d7;
    *puVar8 = 0;
  }
  local_48.list =
       &pLVar4->opHelperSpilledLiveranges->
        super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>;
  uVar12 = 0;
  uVar16 = 0;
  local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  while( true ) {
    do {
      if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
          (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_005809d7;
        *puVar8 = 0;
      }
      pLVar4 = local_38;
      pSVar17 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
                 &(local_48.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar17 == (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list) {
        if (uVar12 != (local_38->opHelperSpilledRegs).word) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x19a,"(bv.Equal(this->opHelperSpilledRegs))",
                             "bv.Equal(this->opHelperSpilledRegs)");
          if (!bVar5) goto LAB_005809d7;
          *puVar8 = 0;
        }
        uVar12 = 0;
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
          if ((((pLVar4->tempRegs).word >> (uVar12 & 0x3f) & 1) != 0) &&
             (uVar12 != pLVar4->tempRegLifetimes[uVar12]->reg)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1a0,"(this->tempRegLifetimes[i]->reg == i)",
                               "this->tempRegLifetimes[i]->reg == i");
            if (!bVar5) goto LAB_005809d7;
            *puVar8 = 0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x21);
        uVar12 = (pLVar4->secondChanceRegs).word;
        if (uVar12 != 0) {
          uVar18 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar18);
            pLVar2 = local_38->regContent[uVar18];
            if (pLVar2 == (Lifetime *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x1a7,"(lifetime)","lifetime");
              if (!bVar5) goto LAB_005809d7;
              *puVar8 = 0;
            }
            this_00 = pLVar2->sym;
            if ((pLVar2->field_0x9d & 2) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x1a9,"(lifetime->isSecondChanceAllocated)",
                                 "lifetime->isSecondChanceAllocated");
              if (!bVar5) goto LAB_005809d7;
              *puVar8 = 0;
            }
            bVar5 = StackSym::IsConst(this_00);
            if ((!bVar5) && ((this_00->field_0x19 & 0x10) == 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x1aa,"(sym->IsConst() || sym->IsAllocated())",
                                 "sym->IsConst() || sym->IsAllocated()");
              if (!bVar5) goto LAB_005809d7;
              *puVar8 = 0;
            }
            uVar12 = uVar12 & ~(1L << (uVar18 & 0x3f));
            uVar18 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
          } while (uVar12 != 0);
        }
        return;
      }
      local_48.current = (NodeBase *)pSVar17;
      ppLVar9 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
      RVar1 = (*ppLVar9)->reg;
      BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
      if ((uVar12 >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x18d,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
        if (!bVar5) goto LAB_005809d7;
        *puVar8 = 0;
      }
      pLVar10 = *ppLVar9;
      if ((pLVar10->field_0x9c & 0x40) == 0) {
        RVar1 = pLVar10->reg;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
        pLVar10 = *ppLVar9;
        uVar11 = *(ushort *)&pLVar10->field_0x9c;
        if ((uVar11 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x191,"(lifetime->isOpHelperSpilled)","lifetime->isOpHelperSpilled");
          if (!bVar5) goto LAB_005809d7;
          *puVar8 = 0;
          pLVar10 = *ppLVar9;
          uVar11 = *(ushort *)&pLVar10->field_0x9c;
        }
        uVar12 = uVar12 | 1L << ((ulong)RVar1 & 0x3f);
        if ((uVar11 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x192,"(!lifetime->isSpilled)","!lifetime->isSpilled");
          if (!bVar5) goto LAB_005809d7;
          *puVar8 = 0;
          pLVar10 = *ppLVar9;
        }
      }
      bVar5 = uVar16 <= pLVar10->end;
      uVar16 = pLVar10->end;
    } while (bVar5);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x194,"(lifetime->end >= lastend)","lifetime->end >= lastend");
    if (!bVar5) break;
    *puVar8 = 0;
    uVar16 = (*ppLVar9)->end;
  }
LAB_005809d7:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
LinearScan::CheckInvariants() const
{
    BitVector bv = this->nonAllocatableRegs;
    uint32 lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->activeLiveranges)
    {
        // Make sure there are only one lifetime per reg
        Assert(!bv.Test(lifetime->reg));
        bv.Set(lifetime->reg);
        Assert(!lifetime->isOpHelperSpilled);
        Assert(!lifetime->isSpilled);
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the active reg bit vector is correct
    Assert(bv.Equal(this->activeRegs));

    uint ints = 0, floats = 0;
    FOREACH_BITSET_IN_UNITBV(index, this->activeRegs, BitVector)
    {
        if (IRType_IsFloat(RegTypes[index]))
        {
            floats++;
        }
        else
        {
            ints++;
        }
    }
    NEXT_BITSET_IN_UNITBV;
    Assert(ints == this->intRegUsedCount);
    Assert(floats == this->floatRegUsedCount);
    Assert((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count());

    bv.ClearAll();

    lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
    {
        // Make sure there are only one lifetime per reg in the op helper spilled liveranges
        Assert(!bv.Test(lifetime->reg));
        if (!lifetime->cantOpHelperSpill)
        {
            bv.Set(lifetime->reg);
            Assert(lifetime->isOpHelperSpilled);
            Assert(!lifetime->isSpilled);
        }
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the opHelperSpilledRegs bit vector is correct
    Assert(bv.Equal(this->opHelperSpilledRegs));

    for (int i = 0; i < RegNumCount; i++)
    {
        if (this->tempRegs.Test(i))
        {
            Assert(this->tempRegLifetimes[i]->reg == i);
        }
    }

    FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
    {
        Lifetime *lifetime = this->regContent[reg];
        Assert(lifetime);
        StackSym *sym = lifetime->sym;
        Assert(lifetime->isSecondChanceAllocated);
        Assert(sym->IsConst() || sym->IsAllocated());  // Should have been spilled already.
    } NEXT_BITSET_IN_UNITBV;

}